

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindow * CreateNewWindow(char *name,ImVec2 size,ImGuiWindowFlags flags)

{
  ImGuiWindow *pIVar1;
  ImGuiWindowSettings *pIVar2;
  iterator it;
  float fVar3;
  ImVec2 IVar4;
  bool local_81;
  ImGuiWindowSettings *settings;
  ImGuiWindow *local_30;
  ImGuiWindow *window;
  ImGuiContext *g;
  char *pcStack_18;
  ImGuiWindowFlags flags_local;
  char *name_local;
  ImVec2 size_local;
  
  window = (ImGuiWindow *)GImGui;
  g._4_4_ = flags;
  pcStack_18 = name;
  name_local = (char *)size;
  ImGui::MemAlloc(0x3d0);
  pIVar1 = (ImGuiWindow *)operator_new(0x3d0);
  ImGuiWindow::ImGuiWindow(pIVar1,(ImGuiContext *)window,pcStack_18);
  pIVar1->Flags = g._4_4_;
  local_30 = pIVar1;
  ImGuiStorage::SetVoidPtr((ImGuiStorage *)&window[6].LastFrameActive,pIVar1->ID,pIVar1);
  ImVec2::ImVec2((ImVec2 *)((long)&settings + 4),60.0,60.0);
  local_30->Pos = stack0xffffffffffffffb4;
  if (((g._4_4_ & 0x100) == 0) &&
     (pIVar2 = ImGui::FindWindowSettings(local_30->ID), pIVar2 != (ImGuiWindowSettings *)0x0)) {
    SetWindowConditionAllowFlags(local_30,4,false);
    IVar4 = ImFloor(&pIVar2->Pos);
    local_30->Pos = IVar4;
    local_30->Collapsed = (bool)(pIVar2->Collapsed & 1);
    fVar3 = ImLengthSqr(&pIVar2->Size);
    if (1e-05 < fVar3) {
      name_local = (char *)ImFloor(&pIVar2->Size);
    }
  }
  local_30->SizeFullAtLastBegin = (ImVec2)name_local;
  local_30->SizeFull = local_30->SizeFullAtLastBegin;
  local_30->Size = local_30->SizeFull;
  if ((g._4_4_ & 0x40) == 0) {
    if ((local_30->Size).x <= 0.0) {
      local_30->AutoFitFramesX = 2;
    }
    if ((local_30->Size).y <= 0.0) {
      local_30->AutoFitFramesY = 2;
    }
    local_81 = true;
    if (local_30->AutoFitFramesX < 1) {
      local_81 = 0 < local_30->AutoFitFramesY;
    }
    local_30->AutoFitOnlyGrows = local_81;
  }
  else {
    local_30->AutoFitFramesY = 2;
    local_30->AutoFitFramesX = 2;
    local_30->AutoFitOnlyGrows = false;
  }
  if ((g._4_4_ & 0x2000) == 0) {
    ImVector<ImGuiWindow_*>::push_back
              ((ImVector<ImGuiWindow_*> *)&window[6].InnerMainRect,&local_30);
  }
  else {
    pIVar1 = window + 6;
    it = ImVector<ImGuiWindow_*>::begin((ImVector<ImGuiWindow_*> *)&window[6].InnerMainRect);
    ImVector<ImGuiWindow_*>::insert((ImVector<ImGuiWindow_*> *)&pIVar1->InnerMainRect,it,&local_30);
  }
  return local_30;
}

Assistant:

static ImGuiWindow* CreateNewWindow(const char* name, ImVec2 size, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;

    // Create window the first time
    ImGuiWindow* window = IM_NEW(ImGuiWindow)(&g, name);
    window->Flags = flags;
    g.WindowsById.SetVoidPtr(window->ID, window);

    // Default/arbitrary window position. Use SetNextWindowPos() with the appropriate condition flag to change the initial position of a window.
    window->Pos = ImVec2(60, 60);

    // User can disable loading and saving of settings. Tooltip and child windows also don't store settings.
    if (!(flags & ImGuiWindowFlags_NoSavedSettings))
    {
        // Retrieve settings from .ini file
        if (ImGuiWindowSettings* settings = ImGui::FindWindowSettings(window->ID))
        {
            SetWindowConditionAllowFlags(window, ImGuiCond_FirstUseEver, false);
            window->Pos = ImFloor(settings->Pos);
            window->Collapsed = settings->Collapsed;
            if (ImLengthSqr(settings->Size) > 0.00001f)
                size = ImFloor(settings->Size);
        }
    }
    window->Size = window->SizeFull = window->SizeFullAtLastBegin = size;

    if ((flags & ImGuiWindowFlags_AlwaysAutoResize) != 0)
    {
        window->AutoFitFramesX = window->AutoFitFramesY = 2;
        window->AutoFitOnlyGrows = false;
    }
    else
    {
        if (window->Size.x <= 0.0f)
            window->AutoFitFramesX = 2;
        if (window->Size.y <= 0.0f)
            window->AutoFitFramesY = 2;
        window->AutoFitOnlyGrows = (window->AutoFitFramesX > 0) || (window->AutoFitFramesY > 0);
    }

    if (flags & ImGuiWindowFlags_NoBringToFrontOnFocus)
        g.Windows.insert(g.Windows.begin(), window); // Quite slow but rare and only once
    else
        g.Windows.push_back(window);
    return window;
}